

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Instr * __thiscall LowererMD::Simd128LowerShuffle_4(LowererMD *this,Instr *instr)

{
  char cVar1;
  OpCode OVar2;
  Opnd *dstOpnd;
  Type pOVar3;
  Instr *pIVar4;
  code *pcVar5;
  Opnd *pOVar6;
  uint8 i_1;
  OpndKind OVar7;
  int32 iVar8;
  SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Type *ppOVar9;
  undefined4 *puVar10;
  RegOpnd *dst;
  RegOpnd *dst_00;
  RegOpnd *dstOpnd_00;
  intptr_t pMemLoc;
  MemRefOpnd *src1Opnd;
  Instr *pIVar11;
  byte *lanes_00;
  char *this_01;
  RegOpnd *pRVar12;
  uint8 j1;
  byte bVar13;
  ulong uVar14;
  uint8 i;
  RegOpnd *src1;
  long lVar15;
  uint8 j2;
  byte bVar16;
  bool bVar17;
  RegOpnd *pRStack_98;
  Opnd *srcs [6];
  uint8 lanesSrc [4];
  uint fromSrc2;
  byte local_54 [4];
  byte local_50 [4];
  uint8 ordLanes [4];
  uint8 reArrLanes [4];
  uint fromSrc1;
  byte local_34 [8];
  uint8 lanes [4];
  
  OVar2 = instr->m_opcode;
  this_00 = Simd128GetExtendedArgs(this,instr);
  ppOVar9 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>);
  dstOpnd = *ppOVar9;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
             this_00->allocator);
  srcs[3] = (Opnd *)0x0;
  srcs[4] = (Opnd *)0x0;
  srcs[1] = (Opnd *)0x0;
  srcs[2] = (Opnd *)0x0;
  pRStack_98 = (RegOpnd *)0x0;
  srcs[0] = (Opnd *)0x0;
  if ((SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
      (this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this_00) {
    uVar14 = 0;
    do {
      ppOVar9 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      pOVar3 = *ppOVar9;
      SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
                 this_00->allocator);
      srcs[uVar14 - 1] = pOVar3;
      if ((SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
          (this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next == this_00) break;
      bVar17 = uVar14 < 5;
      uVar14 = uVar14 + 1;
    } while (bVar17);
  }
  pIVar4 = instr->m_prev;
  IRType_IsSimd128(dstOpnd->m_type);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar10 = 1;
  bVar17 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                      ,0x61f,
                      "(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128())"
                      ,
                      "dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128()"
                     );
  if (!bVar17) {
LAB_0067998c:
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  *puVar10 = 0;
  if (((OVar2 != Simd128_Shuffle_I4) && (OVar2 != Simd128_Shuffle_F4)) &&
     (OVar2 != Simd128_Shuffle_U4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x620,
                        "(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4)"
                        ,
                        "irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4"
                       );
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  pOVar6 = srcs[1];
  if (((srcs[1] == (Opnd *)0x0) ||
      (OVar7 = IR::Opnd::GetKind(srcs[1]), srcs[2] == (Opnd *)0x0 || OVar7 != OpndKindIntConst)) ||
     ((OVar7 = IR::Opnd::GetKind(srcs[2]), srcs[3] == (Opnd *)0x0 || OVar7 != OpndKindIntConst ||
      ((OVar7 = IR::Opnd::GetKind(srcs[3]), srcs[4] == (Opnd *)0x0 || OVar7 != OpndKindIntConst ||
       (OVar7 = IR::Opnd::GetKind(srcs[4]), OVar7 != OpndKindIntConst)))))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x626,
                        "(srcs[2] && srcs[2]->IsIntConstOpnd() && srcs[3] && srcs[3]->IsIntConstOpnd() && srcs[4] && srcs[4]->IsIntConstOpnd() && srcs[5] && srcs[5]->IsIntConstOpnd())"
                        ,"Type-specialized shuffle is supported only with constant lane indices");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  OVar7 = IR::Opnd::GetKind(pOVar6);
  if (OVar7 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  iVar8 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)pOVar6);
  pOVar6 = srcs[2];
  local_34[0] = (byte)iVar8;
  OVar7 = IR::Opnd::GetKind(srcs[2]);
  if (OVar7 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  iVar8 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)pOVar6);
  pOVar6 = srcs[3];
  local_34[1] = (byte)iVar8;
  OVar7 = IR::Opnd::GetKind(srcs[3]);
  if (OVar7 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  iVar8 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)pOVar6);
  this_01 = (char *)srcs[4];
  local_34[2] = (byte)iVar8;
  OVar7 = IR::Opnd::GetKind(srcs[4]);
  if (OVar7 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                        ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  iVar8 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)this_01);
  local_34[3] = (byte)iVar8;
  if (7 < local_34[0]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62c,"(lanes[0] >= 0 && lanes[0] < 8)","lanes[0] >= 0 && lanes[0] < 8");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  if (7 < local_34[1]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62d,"(lanes[1] >= 0 && lanes[1] < 8)","lanes[1] >= 0 && lanes[1] < 8");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  if (7 < local_34[2]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62e,"(lanes[2] >= 0 && lanes[2] < 8)","lanes[2] >= 0 && lanes[2] < 8");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  if (7 < local_34[3]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x62f,"(lanes[3] >= 0 && lanes[3] < 8)","lanes[3] >= 0 && lanes[3] < 8");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  CheckShuffleLanes_4((LowererMD *)this_01,local_34,(uint8 *)(srcs + 5),(uint *)ordLanes,
                      (uint *)((long)srcs + 0x2c));
  if (srcs[5]._4_4_ + (int)ordLanes != 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                        ,0x632,"(fromSrc1 + fromSrc2 == 4)","fromSrc1 + fromSrc2 == 4");
    if (!bVar17) goto LAB_0067998c;
    *puVar10 = 0;
  }
  if (srcs[5]._4_4_ == 4 || ordLanes == (uint8  [4])0x4) {
    if (ordLanes != (uint8  [4])0x4) {
      pRStack_98 = (RegOpnd *)srcs[0];
    }
    lanes_00 = local_34;
    pRVar12 = pRStack_98;
  }
  else {
    if (ordLanes != (uint8  [4])0x2) {
      if (srcs[5]._4_4_ == 3 || ordLanes == (uint8  [4])0x3) {
        dst = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
        dst_00 = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
        dstOpnd_00 = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
        src1 = pRStack_98;
        pRVar12 = (RegOpnd *)srcs[0];
        if (ordLanes == (uint8  [4])0x3) {
          src1 = (RegOpnd *)srcs[0];
          pRVar12 = pRStack_98;
        }
        if (srcs[0] == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar17 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                              ,0x66a,"(majSrc != minSrc)","majSrc != minSrc");
          if (!bVar17) goto LAB_0067998c;
          *puVar10 = 0;
        }
        lVar15 = 0;
        do {
          if (((byte)((src1 != (RegOpnd *)0x0) * '\x04') <= local_34[lVar15]) &&
             (local_34[lVar15] < (byte)((src1 != (RegOpnd *)0x0) * '\x04' + 4U))) goto LAB_00679751;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        lVar15 = 0;
LAB_00679751:
        pMemLoc = ThreadContextInfo::GetX86FourLanesMaskAddr
                            (this->m_func->m_threadContextInfo,(uint8)lVar15);
        src1Opnd = IR::MemRefOpnd::New(pMemLoc,dstOpnd->m_type,this->m_func,AddrOpndKindDynamicMisc)
        ;
        InsertShufps(this,local_34,&dst->super_Opnd,&pRVar12->super_Opnd,&pRVar12->super_Opnd,instr)
        ;
        InsertShufps(this,local_34,&dst_00->super_Opnd,&src1->super_Opnd,&src1->super_Opnd,instr);
        pIVar11 = IR::Instr::New(MOVUPS,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr,pIVar11);
        Legalize<false>(pIVar11,false);
        pIVar11 = IR::Instr::New(ANDPS,&dst_00->super_Opnd,&dst_00->super_Opnd,
                                 &dstOpnd_00->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr,pIVar11);
        Legalize<false>(pIVar11,false);
        pIVar11 = IR::Instr::New(ANDNPS,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,
                                 &dst->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr,pIVar11);
        Legalize<false>(pIVar11,false);
        pIVar11 = IR::Instr::New(ORPS,dstOpnd,&dst_00->super_Opnd,&dstOpnd_00->super_Opnd,
                                 this->m_func);
        IR::Instr::InsertBefore(instr,pIVar11);
        Legalize<false>(pIVar11,false);
      }
      goto LAB_00679585;
    }
    if ((local_34[0] < 4) && (local_34[1] < 4)) {
      if ((local_34[2] < 4) || (local_34[3] < 4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar17 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                            ,0x63f,"(lanes[2] >= 4 && lanes[3] >= 4)",
                            "lanes[2] >= 4 && lanes[3] >= 4");
        if (!bVar17) goto LAB_0067998c;
        *puVar10 = 0;
      }
      lanes_00 = local_34;
      pRVar12 = (RegOpnd *)srcs[0];
    }
    else {
      bVar16 = 2;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar15 = 0;
      bVar13 = 0;
      do {
        cVar1 = *(char *)((long)srcs + lVar15 + 0x28);
        if (bVar13 < 4 && cVar1 == '\x01') {
          local_54[bVar13] = local_34[lVar15];
          local_50[lVar15] = bVar13;
          bVar13 = bVar13 + 1;
        }
        else if (bVar16 < 4) {
          if (cVar1 != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar17 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                                ,0x653,"(lanesSrc[i] == 2)","lanesSrc[i] == 2");
            if (!bVar17) goto LAB_0067998c;
            *puVar10 = 0;
          }
          local_54[bVar16] = local_34[lVar15];
          local_50[lVar15] = bVar16;
          bVar16 = bVar16 + 1;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      pRStack_98 = IR::RegOpnd::New(dstOpnd->m_type,this->m_func);
      InsertShufps(this,local_54,&pRStack_98->super_Opnd,(Opnd *)0x0,srcs[0],instr);
      lanes_00 = local_50;
      pRVar12 = pRStack_98;
    }
  }
  InsertShufps(this,lanes_00,dstOpnd,&pRStack_98->super_Opnd,&pRVar12->super_Opnd,instr);
LAB_00679585:
  IR::Instr::Remove(instr);
  return pIVar4;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerShuffle_4(IR::Instr* instr)
{
    Js::OpCode irOpcode = instr->m_opcode;
    SList<IR::Opnd*> *args = Simd128GetExtendedArgs(instr);
    IR::Opnd *dst = args->Pop();
    IR::Opnd *srcs[6] = { nullptr, nullptr, nullptr, nullptr, nullptr, nullptr };

    int j = 0;
    while (!args->Empty() && j < 6)
    {
        srcs[j++] = args->Pop();
    }

    uint8 lanes[4], lanesSrc[4];
    uint fromSrc1, fromSrc2;
    IR::Instr *pInstr = instr->m_prev;

    Assert(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128());
    Assert(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4);

    // globOpt will type-spec if all lane indices are constants, and within range constraints to match a single SSE instruction
    AssertMsg(srcs[2] && srcs[2]->IsIntConstOpnd() &&
              srcs[3] && srcs[3]->IsIntConstOpnd() &&
              srcs[4] && srcs[4]->IsIntConstOpnd() &&
              srcs[5] && srcs[5]->IsIntConstOpnd(), "Type-specialized shuffle is supported only with constant lane indices");

    lanes[0] = (uint8) srcs[2]->AsIntConstOpnd()->AsInt32();
    lanes[1] = (uint8) srcs[3]->AsIntConstOpnd()->AsInt32();
    lanes[2] = (uint8) srcs[4]->AsIntConstOpnd()->AsInt32();
    lanes[3] = (uint8) srcs[5]->AsIntConstOpnd()->AsInt32();
    Assert(lanes[0] >= 0 && lanes[0] < 8);
    Assert(lanes[1] >= 0 && lanes[1] < 8);
    Assert(lanes[2] >= 0 && lanes[2] < 8);
    Assert(lanes[3] >= 0 && lanes[3] < 8);

    CheckShuffleLanes_4(lanes, lanesSrc, &fromSrc1, &fromSrc2);
    Assert(fromSrc1 + fromSrc2 == 4);

    if (fromSrc1 == 4 || fromSrc2 == 4)
    {
        // can be done with a swizzle
        IR::Opnd *srcOpnd = fromSrc1 == 4 ? srcs[0] : srcs[1];
        InsertShufps(lanes, dst, srcOpnd, srcOpnd, instr);
    }
    else if (fromSrc1 == 2)
    {
        if (lanes[0] < 4 && lanes[1] < 4)
        {
            // x86 friendly shuffle
            Assert(lanes[2] >= 4 && lanes[3] >= 4);
            InsertShufps(lanes, dst, srcs[0], srcs[1], instr);
        }
        else
        {
            // arbitrary shuffle with 2 lanes from each src
            uint8 ordLanes[4], reArrLanes[4];

            // order lanes based on which src they come from
            // compute re-arrangement mask
            for (uint8 i = 0, j1 = 0, j2 = 2; i < 4; i++)
            {
                if (lanesSrc[i] == 1 && j1 < 4)
                {
                    ordLanes[j1] = lanes[i];
                    reArrLanes[i] = j1;
                    j1++;
                }
                else if(j2 < 4)
                {
                    Assert(lanesSrc[i] == 2);
                    ordLanes[j2] = lanes[i];
                    reArrLanes[i] = j2;
                    j2++;
                }
            }
            IR::RegOpnd *temp = IR::RegOpnd::New(dst->GetType(), m_func);
            InsertShufps(ordLanes, temp, srcs[0], srcs[1], instr);
            InsertShufps(reArrLanes, dst, temp, temp, instr);
        }
    }
    else if (fromSrc1 == 3 || fromSrc2 == 3)
    {
        // shuffle with 3 lanes from one src, one from another

        IR::Instr *newInstr;
        IR::Opnd * majSrc, *minSrc;
        IR::RegOpnd *temp1 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp2 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp3 = IR::RegOpnd::New(dst->GetType(), m_func);
        uint8 minorityLane = 0, maxLaneValue;
        majSrc = fromSrc1 == 3 ? srcs[0] : srcs[1];
        minSrc = fromSrc1 == 3 ? srcs[1] : srcs[0];
        Assert(majSrc != minSrc);

        // Algorithm:
        // SHUFPS temp1, majSrc, lanes
        // SHUFPS temp2, minSrc, lanes
        // MOVUPS temp3, [minorityLane mask]
        // ANDPS  temp2, temp3          // mask all lanes but minorityLane
        // ANDNPS temp3, temp1          // zero minorityLane
        // ORPS   dst, temp2, temp3

        // find minorityLane to mask
        maxLaneValue = minSrc == srcs[0] ? 4 : 8;
        for (uint8 i = 0; i < 4; i++)
        {
            if (lanes[i] >= (maxLaneValue - 4) && lanes[i] < maxLaneValue)
            {
                minorityLane = i;
                break;
            }
        }
        IR::MemRefOpnd * laneMask = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86FourLanesMaskAddr(minorityLane), dst->GetType(), m_func);

        InsertShufps(lanes, temp1, majSrc, majSrc, instr);
        InsertShufps(lanes, temp2, minSrc, minSrc, instr);
        newInstr = IR::Instr::New(Js::OpCode::MOVUPS, temp3, laneMask, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDPS, temp2, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDNPS, temp3, temp3, temp1, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ORPS, dst, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }

    instr->Remove();
    return pInstr;
}